

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

int Abc_NtkSopToAig(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  char *pSop;
  int iVar2;
  Hop_Man_t *p;
  Vec_Ptr_t *pVVar3;
  Hop_Obj_t *pHVar4;
  long lVar5;
  bool bVar6;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x32f,"int Abc_NtkSopToAig(Abc_Ntk_t *)");
  }
  p = Hop_ManStart();
  iVar2 = Abc_NtkGetFaninMax(pNtk);
  if (iVar2 != 0) {
    Hop_IthVar(p,iVar2 + -1);
  }
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar5];
      if (((plVar1 != (long *)0x0) && (bVar6 = (*(uint *)((long)plVar1 + 0x14) & 0xf) != 7, !bVar6))
         && ((bVar6 || (((*(int *)(*plVar1 + 4) != 4 || (*(int *)((long)plVar1 + 0x1c) != 1)) ||
                        (plVar1[7] != 0)))))) {
        pSop = (char *)plVar1[7];
        if (pSop == (char *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                        ,0x33e,"int Abc_NtkSopToAig(Abc_Ntk_t *)");
        }
        iVar2 = Abc_SopGetVarNum(pSop);
        if (iVar2 == 0) {
          pHVar4 = p->pConst1;
          iVar2 = Abc_SopIsConst0(pSop);
          pHVar4 = (Hop_Obj_t *)((long)iVar2 ^ (ulong)pHVar4);
        }
        else {
          iVar2 = Abc_SopGetVarNum(pSop);
          if (((iVar2 < 3) || (iVar2 = Abc_SopGetCubeNum(pSop), iVar2 < 2)) ||
             (iVar2 = Abc_SopIsExorType(pSop), iVar2 != 0)) {
            pHVar4 = Abc_ConvertSopToAigInternal(p,pSop);
          }
          else {
            pHVar4 = Dec_GraphFactorSop(p,pSop);
          }
        }
        plVar1[7] = (long)pHVar4;
        if (pHVar4 == (Hop_Obj_t *)0x0) {
          Hop_ManStop(p);
          puts("Abc_NtkSopToAig: Error while converting SOP into AIG.");
          return 0;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar5 < pVVar3->nSize);
  }
  Mem_FlexStop((Mem_Flex_t *)pNtk->pManFunc,0);
  pNtk->pManFunc = p;
  pNtk->ntkFunc = ABC_FUNC_AIG;
  return 1;
}

Assistant:

int Abc_NtkSopToAig( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Hop_Man_t * pMan;
    int i, Max;

    assert( Abc_NtkHasSop(pNtk) ); 

    // make dist1-free and SCC-free
//    Abc_NtkMakeLegit( pNtk );

    // start the functionality manager
    pMan = Hop_ManStart();
    Max = Abc_NtkGetFaninMax(pNtk);
    if ( Max ) Hop_IthVar( pMan, Max-1 );

    // convert each node from SOP to BDD
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        assert( pNode->pData );
        pNode->pData = Abc_ConvertSopToAig( pMan, (char *)pNode->pData );
        if ( pNode->pData == NULL )
        {
            Hop_ManStop( pMan );
            printf( "Abc_NtkSopToAig: Error while converting SOP into AIG.\n" );
            return 0;
        }
    }
    Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
    pNtk->pManFunc = pMan;

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_AIG;
    return 1;
}